

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_lock.c
# Opt level: O2

void IntCManager_lock(CManager cm,char *file,int line)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  timespec ts;
  
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(cm,CMLowLevelVerbose);
    if (iVar1 == 0) goto LAB_00123152;
  }
  else if (CMtrace_val[3] == 0) goto LAB_00123152;
  if (CMtrace_PID != 0) {
    __stream = (FILE *)cm->CMTrace_file;
    _Var2 = getpid();
    pVar3 = pthread_self();
    fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,(timespec *)&ts);
    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
  }
  fprintf((FILE *)cm->CMTrace_file,"CManager Lock at \"%s\" line %d\n",file,(ulong)(uint)line);
LAB_00123152:
  fflush((FILE *)cm->CMTrace_file);
  pthread_mutex_lock((pthread_mutex_t *)&cm->exchange_lock);
  iVar1 = cm->locked;
  cm->locked = iVar1 + 1;
  if (iVar1 != 0) {
    printf("CManager lock inconsistency, %d\n");
  }
  return;
}

Assistant:

extern void
IntCManager_lock(CManager cm, const char *file, int line)
{
    CMtrace_out(cm, CMLowLevelVerbose, "CManager Lock at \"%s\" line %d\n",
		file, line);
    thr_mutex_lock(cm->exchange_lock);
    cm->locked++;
    if (cm->locked != 1) {
	printf("CManager lock inconsistency, %d\n", cm->locked);
    }
}